

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall fizplex::LPTest_GetValue_Test::LPTest_GetValue_Test(LPTest_GetValue_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c0228;
  return;
}

Assistant:

TEST(LPTest, GetValue) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Range, 3, 15);
  const double d = 3.14;
  lp.add_value(0, 0, d);
  EXPECT_DOUBLE_EQ(d, lp.get_value(0, 0));
}